

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  byte *pbVar1;
  sqlite3 *psVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  
  if ((bPreserve == 0 || pMem->szMalloc < 1) || (pMem->z != pMem->zMalloc)) {
    if (0 < pMem->szMalloc) {
      sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
    }
    if (pMem->db == (sqlite3 *)0x0) {
      pcVar5 = (char *)sqlite3Malloc((long)n);
    }
    else {
      pcVar5 = (char *)sqlite3DbMallocRawNN(pMem->db,(long)n);
    }
    pMem->zMalloc = pcVar5;
    bVar6 = bPreserve == 0;
  }
  else {
    pcVar5 = (char *)sqlite3DbReallocOrFree(pMem->db,pMem->z,(long)n);
    pMem->zMalloc = pcVar5;
    pMem->z = pcVar5;
    bVar6 = true;
  }
  pcVar5 = pMem->zMalloc;
  if (pcVar5 == (char *)0x0) {
    if ((pMem->flags & 0x2400) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    iVar4 = 7;
  }
  else {
    psVar2 = pMem->db;
    if (((psVar2 == (sqlite3 *)0x0) || (pcVar5 < (psVar2->lookaside).pStart)) ||
       ((psVar2->lookaside).pEnd <= pcVar5)) {
      uVar3 = (*sqlite3Config.m.xSize)(pcVar5);
    }
    else {
      uVar3 = (uint)(psVar2->lookaside).sz;
    }
    pMem->szMalloc = uVar3;
    if ((!bVar6) && (pMem->z != (char *)0x0)) {
      memcpy(pMem->zMalloc,pMem->z,(long)pMem->n);
    }
    if ((pMem->flags & 0x400) != 0) {
      (*pMem->xDel)(pMem->z);
    }
    pMem->z = pMem->zMalloc;
    pbVar1 = (byte *)((long)&pMem->flags + 1);
    *pbVar1 = *pbVar1 & 0xe3;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db, pMem->zMalloc) );
  if( pMem->szMalloc>0 && bPreserve && pMem->z==pMem->zMalloc ){
    pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z ){
    assert( pMem->z!=pMem->zMalloc );
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}